

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_copy_wcs(archive_mstring *aes,wchar_t *wcs)

{
  wchar_t wVar1;
  wchar_t *in_RSI;
  archive_mstring *in_RDI;
  wchar_t *wcs_00;
  
  if (in_RSI == (wchar_t *)0x0) {
    wcs_00 = (wchar_t *)0x0;
  }
  else {
    wcs_00 = (wchar_t *)wcslen(in_RSI);
  }
  wVar1 = archive_mstring_copy_wcs_len(in_RDI,wcs_00,0x113383);
  return wVar1;
}

Assistant:

int
archive_mstring_copy_wcs(struct archive_mstring *aes, const wchar_t *wcs)
{
	return archive_mstring_copy_wcs_len(aes, wcs,
				wcs == NULL ? 0 : wcslen(wcs));
}